

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_database.cpp
# Opt level: O0

bool __thiscall
fineftp::UserDatabase::addUser
          (UserDatabase *this,string *username,string *password,string *param_3,
          Permission permissions)

{
  bool bVar1;
  FtpUser *pFVar2;
  ostream *poVar3;
  shared_ptr<fineftp::FtpUser> local_80;
  _Self local_70;
  _Self local_68;
  iterator user_it;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> database_lock;
  Permission permissions_local;
  string *local_root_path_local;
  string *password_local;
  string *username_local;
  UserDatabase *this_local;
  
  database_lock._M_device._4_4_ = permissions;
  ::std::lock_guard<std::mutex>::lock_guard(&local_40,&this->database_mutex_);
  bVar1 = isUsernameAnonymousUser(this,username);
  if (bVar1) {
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->anonymous_user_);
    if (bVar1) {
      poVar3 = ::std::operator<<((ostream *)&::std::cerr,"Error adding user with username \"");
      poVar3 = ::std::operator<<(poVar3,(string *)username);
      poVar3 = ::std::operator<<(poVar3,
                                 "\". The username denotes the anonymous user, which is already present."
                                );
      ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      pFVar2 = (FtpUser *)operator_new(0x48);
      FtpUser::FtpUser(pFVar2,password,param_3,database_lock._M_device._4_4_);
      ::std::shared_ptr<fineftp::FtpUser>::shared_ptr<fineftp::FtpUser,void>
                ((shared_ptr<fineftp::FtpUser> *)&user_it,pFVar2);
      ::std::shared_ptr<fineftp::FtpUser>::operator=
                (&this->anonymous_user_,(shared_ptr<fineftp::FtpUser> *)&user_it);
      ::std::shared_ptr<fineftp::FtpUser>::~shared_ptr((shared_ptr<fineftp::FtpUser> *)&user_it);
      poVar3 = ::std::operator<<((ostream *)&::std::cout,"Successfully added anonymous user.");
      ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
  }
  else {
    local_68._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>_>
         ::find(&this->database_,username);
    local_70._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>_>
         ::end(&this->database_);
    bVar1 = ::std::operator==(&local_68,&local_70);
    if (bVar1) {
      pFVar2 = (FtpUser *)operator_new(0x48);
      FtpUser::FtpUser(pFVar2,password,param_3,database_lock._M_device._4_4_);
      ::std::shared_ptr<fineftp::FtpUser>::shared_ptr<fineftp::FtpUser,void>(&local_80,pFVar2);
      ::std::
      map<std::__cxx11::string,std::shared_ptr<fineftp::FtpUser>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
      ::emplace<std::__cxx11::string_const&,std::shared_ptr<fineftp::FtpUser>>
                ((map<std::__cxx11::string,std::shared_ptr<fineftp::FtpUser>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
                  *)&this->database_,username,&local_80);
      ::std::shared_ptr<fineftp::FtpUser>::~shared_ptr(&local_80);
      poVar3 = ::std::operator<<((ostream *)&::std::cout,"Successfully added user \"");
      poVar3 = ::std::operator<<(poVar3,(string *)username);
      poVar3 = ::std::operator<<(poVar3,"\".");
      ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      poVar3 = ::std::operator<<((ostream *)&::std::cerr,"Error adding user with username \"");
      poVar3 = ::std::operator<<(poVar3,(string *)username);
      poVar3 = ::std::operator<<(poVar3,"\". The user already exists.");
      ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  ::std::lock_guard<std::mutex>::~lock_guard(&local_40);
  return this_local._7_1_;
}

Assistant:

bool UserDatabase::addUser(const std::string& username, const std::string& password, const std::string& local_root_path, Permission permissions)
  {
    std::lock_guard<decltype(database_mutex_)> database_lock(database_mutex_);

    if (isUsernameAnonymousUser(username))
    {
      if (anonymous_user_)
      {
        std::cerr << "Error adding user with username \"" << username << "\". The username denotes the anonymous user, which is already present." << std::endl;
        return false;
      }
      else
      {
        anonymous_user_ = std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions));
#ifndef NDEBUG
        std::cout << "Successfully added anonymous user." << std::endl;
#endif // !NDEBUG
        return true;
      }
    }
    else
    {
      auto user_it = database_.find(username);
      if (user_it == database_.end())
      {
        database_.emplace(username, std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions)));
#ifndef NDEBUG
        std::cout << "Successfully added user \"" << username << "\"." << std::endl;
#endif // !NDEBUG
        return true;
      }
      else
      {
        std::cerr << "Error adding user with username \"" << username << "\". The user already exists." << std::endl;
        return false;
      }
    }
  }